

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O0

shared_ptr<Scene>
Scene::Create(shared_ptr<myvk::Queue> *graphics_queue,char *filename,
             atomic<const_char_*> *notification_ptr)

{
  bool bVar1;
  element_type *peVar2;
  long in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Scene *in_RSI;
  element_type *in_RDI;
  shared_ptr<Scene> sVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  texture_filenames;
  vector<Scene::Mesh,_std::allocator<Scene::Mesh>_> meshes;
  string base_dir;
  shared_ptr<Scene> ret;
  shared_ptr<myvk::Device> *in_stack_00000188;
  Scene *in_stack_00000190;
  vector<Scene::Mesh,_std::allocator<Scene::Mesh>_> *in_stack_00000390;
  shared_ptr<myvk::Queue> *in_stack_00000398;
  Scene *in_stack_000003a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_000004e0;
  vector<Scene::Mesh,_std::allocator<Scene::Mesh>_> *in_stack_000004e8;
  char *in_stack_000004f0;
  char *in_stack_000004f8;
  shared_ptr<Scene> *in_stack_ffffffffffffff08;
  element_type *in_stack_ffffffffffffff10;
  __pointer_type in_stack_ffffffffffffff18;
  vector<Scene::Mesh,_std::allocator<Scene::Mesh>_> *in_stack_ffffffffffffff20;
  pointer in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  float in_stack_ffffffffffffff68;
  VkSamplerMipmapMode in_stack_ffffffffffffff6c;
  VkSamplerAddressMode in_stack_ffffffffffffff70;
  VkFilter in_stack_ffffffffffffff74;
  Ptr<Device> *in_stack_ffffffffffffff78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff90;
  shared_ptr<myvk::Queue> *in_stack_ffffffffffffff98;
  Scene *in_stack_ffffffffffffffa0;
  
  std::make_shared<Scene>();
  get_base_dir_abi_cxx11_((char *)in_stack_ffffffffffffff58);
  std::vector<Scene::Mesh,_std::allocator<Scene::Mesh>_>::vector
            ((vector<Scene::Mesh,_std::allocator<Scene::Mesh>_> *)0x138e35);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x138e3f);
  if (in_RCX != 0) {
    std::atomic<const_char_*>::store
              ((atomic<const_char_*> *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
               (memory_order)((ulong)in_stack_ffffffffffffff10 >> 0x20));
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff10);
  bVar1 = load_meshes(in_stack_000004f8,in_stack_000004f0,in_stack_000004e8,in_stack_000004e0);
  if (bVar1) {
    spdlog::info<char[22],char_const*&>
              ((char (*) [22])in_stack_ffffffffffffff10,(char **)in_stack_ffffffffffffff08);
    if (in_RCX != 0) {
      std::atomic<const_char_*>::store
                ((atomic<const_char_*> *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                 (memory_order)((ulong)in_stack_ffffffffffffff10 >> 0x20));
    }
    std::__shared_ptr_access<Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x138f6f);
    load_buffers_and_draw_cmd(in_stack_000003a0,in_stack_00000398,in_stack_00000390);
    if (in_RCX != 0) {
      std::atomic<const_char_*>::store
                ((atomic<const_char_*> *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                 (memory_order)((ulong)in_stack_ffffffffffffff10 >> 0x20));
    }
    peVar2 = std::__shared_ptr_access<myvk::Queue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<myvk::Queue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x138fba);
    (*(peVar2->super_DeviceObjectBase).super_Base._vptr_Base[2])();
    myvk::Sampler::Create
              (in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,(bool)in_stack_ffffffffffffff67,
               in_stack_ffffffffffffff60);
    std::__shared_ptr_access<Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x13900f);
    in_stack_ffffffffffffff20 =
         (vector<Scene::Mesh,_std::allocator<Scene::Mesh>_> *)&stack0xffffffffffffff58;
    std::shared_ptr<myvk::Sampler>::operator=
              (&in_stack_ffffffffffffff10->m_sampler,
               (shared_ptr<myvk::Sampler> *)in_stack_ffffffffffffff08);
    std::shared_ptr<myvk::Sampler>::~shared_ptr((shared_ptr<myvk::Sampler> *)0x13902b);
    std::__shared_ptr_access<Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x139035);
    load_textures(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    std::__shared_ptr_access<Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x139059);
    process_texture_errors(in_RSI);
    in_stack_ffffffffffffff10 =
         std::__shared_ptr_access<Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                   ((__shared_ptr_access<Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x139070
                   );
    peVar2 = std::__shared_ptr_access<myvk::Queue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<myvk::Queue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x139082);
    (*(peVar2->super_DeviceObjectBase).super_Base._vptr_Base[2])();
    create_descriptors(in_stack_00000190,in_stack_00000188);
    std::shared_ptr<Scene>::shared_ptr
              ((shared_ptr<Scene> *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  }
  else {
    spdlog::error<char[22]>((char (*) [22])0x138ece);
    std::shared_ptr<Scene>::shared_ptr
              ((shared_ptr<Scene> *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffff20);
  std::vector<Scene::Mesh,_std::allocator<Scene::Mesh>_>::~vector(in_stack_ffffffffffffff20);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff10);
  std::shared_ptr<Scene>::~shared_ptr((shared_ptr<Scene> *)0x1390f1);
  sVar3.super___shared_ptr<Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  sVar3.super___shared_ptr<Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<Scene>)sVar3.super___shared_ptr<Scene,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Scene> Scene::Create(const std::shared_ptr<myvk::Queue> &graphics_queue, const char *filename,
                                     std::atomic<const char *> *notification_ptr) {
	std::shared_ptr<Scene> ret = std::make_shared<Scene>();

	std::string base_dir = get_base_dir(filename);

	std::vector<Mesh> meshes;
	std::vector<std::string> texture_filenames;

	if (notification_ptr)
		notification_ptr->store("Loading Mesh");
	if (!load_meshes(filename, base_dir.c_str(), &meshes, &texture_filenames)) {
		spdlog::error("Failed to load meshes");
		return nullptr;
	}
	spdlog::info("Meshes loaded from {}", filename);

	if (notification_ptr)
		notification_ptr->store("Optimizing Mesh and Creating Buffers");
	ret->load_buffers_and_draw_cmd(graphics_queue, meshes);
	if (notification_ptr)
		notification_ptr->store("Loading Textures");
	ret->m_sampler =
	    myvk::Sampler::Create(graphics_queue->GetDevicePtr(), VK_FILTER_LINEAR, VK_SAMPLER_ADDRESS_MODE_REPEAT,
	                          VK_SAMPLER_MIPMAP_MODE_LINEAR, VK_LOD_CLAMP_NONE);
	ret->load_textures(graphics_queue, texture_filenames);
	ret->process_texture_errors();
	ret->create_descriptors(graphics_queue->GetDevicePtr());

	return ret;
}